

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

void __thiscall
MathInterpreter::MathInterpreter
          (MathInterpreter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
          *data)

{
  _List_node_base *p_Var1;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var2;
  
  this->input = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  this->operator_stack =
       (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  this->postfix_expression =
       (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  p_Var1 = (_List_node_base *)operator_new(0x18);
  p_Var1->_M_prev = p_Var1;
  p_Var1->_M_next = p_Var1;
  p_Var1[1]._M_next = (_List_node_base *)0x0;
  this->input = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)p_Var1;
  this->variables = data;
  p_Var2 = (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x50);
  (p_Var2->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(p_Var2,0);
  this->operator_stack =
       (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)p_Var2;
  p_Var2 = (_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)operator_new(0x50);
  (p_Var2->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (p_Var2->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(p_Var2,0);
  this->postfix_expression =
       (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)p_Var2;
  return;
}

Assistant:

MathInterpreter::MathInterpreter(map<string, Variable *> *data) {
  this->input = new list<string>();
  this->variables = data;
  this->operator_stack = new stack<string>();
  this->postfix_expression = new deque<string>();
}